

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btSoftBody_*>::reserve(btAlignedObjectArray<btSoftBody_*> *this,int _Count)

{
  int iVar1;
  uint uVar2;
  btSoftBody **ppbVar3;
  int in_ESI;
  btAlignedObjectArray<btSoftBody_*> *in_RDI;
  btSoftBody **s;
  btAlignedObjectArray<btSoftBody_*> *in_stack_ffffffffffffffe8;
  
  iVar1 = capacity(in_RDI);
  if (iVar1 < in_ESI) {
    ppbVar3 = (btSoftBody **)allocate(in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20));
    uVar2 = size(in_RDI);
    copy(in_RDI,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)uVar2);
    iVar1 = size(in_RDI);
    destroy(in_RDI,0,iVar1);
    deallocate(in_RDI);
    in_RDI->m_ownsMemory = true;
    in_RDI->m_data = ppbVar3;
    in_RDI->m_capacity = in_ESI;
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE	void reserve(int _Count)
		{	// determine new minimum length of allocated storage
			if (capacity() < _Count)
			{	// not enough room, reallocate
				T*	s = (T*)allocate(_Count);

				copy(0, size(), s);

				destroy(0,size());

				deallocate();
				
				//PCK: added this line
				m_ownsMemory = true;

				m_data = s;
				
				m_capacity = _Count;

			}
		}